

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathCacheWrapString(xmlXPathContextPtr ctxt,xmlChar *val)

{
  void *pvVar1;
  bool bVar2;
  long *plVar3;
  xmlXPathObjectPtr pxVar4;
  int iVar5;
  xmlXPathObjectPtr unaff_R14;
  
  if ((ctxt == (xmlXPathContextPtr)0x0) || (pvVar1 = ctxt->cache, pvVar1 == (void *)0x0))
  goto LAB_001e4bba;
  plVar3 = *(long **)((long)pvVar1 + 8);
  if ((plVar3 == (long *)0x0) || (iVar5 = (int)plVar3[1], iVar5 == 0)) {
    plVar3 = *(long **)((long)pvVar1 + 0x20);
    bVar2 = true;
    if ((plVar3 != (long *)0x0) && (iVar5 = (int)plVar3[1], iVar5 != 0)) goto LAB_001e4b96;
  }
  else {
LAB_001e4b96:
    *(int *)(plVar3 + 1) = iVar5 + -1;
    unaff_R14 = *(xmlXPathObjectPtr *)(*plVar3 + -8 + (long)iVar5 * 8);
    unaff_R14->type = XPATH_STRING;
    unaff_R14->stringval = val;
    bVar2 = false;
  }
  if (!bVar2) {
    return unaff_R14;
  }
LAB_001e4bba:
  pxVar4 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
  if (pxVar4 == (xmlXPathObjectPtr)0x0) {
    pxVar4 = (xmlXPathObjectPtr)0x0;
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating string object\n");
  }
  else {
    *(undefined8 *)pxVar4 = 0;
    pxVar4->nodesetval = (xmlNodeSetPtr)0x0;
    pxVar4->stringval = (xmlChar *)0x0;
    pxVar4->user = (void *)0x0;
    *(undefined8 *)&pxVar4->index = 0;
    pxVar4->user2 = (void *)0x0;
    *(undefined8 *)&pxVar4->boolval = 0;
    pxVar4->floatval = 0.0;
    *(undefined8 *)&pxVar4->index2 = 0;
    pxVar4->type = XPATH_STRING;
    pxVar4->stringval = val;
  }
  return pxVar4;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheWrapString(xmlXPathContextPtr ctxt, xmlChar *val)
{
    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if ((cache->stringObjs != NULL) &&
	    (cache->stringObjs->number != 0))
	{

	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->stringObjs->items[--cache->stringObjs->number];
	    ret->type = XPATH_STRING;
	    ret->stringval = val;
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_STRING);
#endif
	    return(ret);
	} else if ((cache->miscObjs != NULL) &&
	    (cache->miscObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;
	    /*
	    * Fallback to misc-cache.
	    */
	    ret = (xmlXPathObjectPtr)
		cache->miscObjs->items[--cache->miscObjs->number];

	    ret->type = XPATH_STRING;
	    ret->stringval = val;
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_STRING);
#endif
	    return(ret);
	}
    }
    return(xmlXPathWrapString(val));
}